

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contract_light_test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_114b::TestClassWithInvariant::TestClassWithInvariant
          (TestClassWithInvariant *this)

{
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  *(undefined1 *)(in_RDI + 3) = 0;
  in_RDI[4] = 0;
  contract_light::v_100::Contract::Contract((Contract *)(in_RDI + 5));
  return;
}

Assistant:

TestClassWithInvariant()
      : x(0)
      , y(0)
      , invariantWasCalled(0)
      , preConditionWasCalled(false)
      , postConditionWasCalled(0)
    {}